

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O2

int __thiscall CConsole::ParseArgs(CConsole *this,CResult *pResult,char *pFormat)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  CConsole *pCVar5;
  CConsole *pCVar6;
  char cVar7;
  CConsole *pCVar8;
  long in_FS_OFFSET;
  char Command;
  char *pFormat_local;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Command = *pFormat;
  bVar2 = false;
  uVar4 = 0;
  pCVar6 = (CConsole *)pResult->m_pArgsStart;
  pFormat_local = pFormat;
  do {
    cVar7 = Command;
    if ((uVar4 != 0) || (Command == '\0')) goto LAB_001239c9;
    if (Command == '?') {
      bVar2 = true;
    }
    else {
      pCVar5 = (CConsole *)str_skip_whitespaces((char *)pCVar6);
      cVar1 = *(char *)&(pCVar5->super_IConsole).super_IInterface._vptr_IInterface;
      this = pCVar6;
      if (cVar1 == '\"') {
        pCVar6 = (CConsole *)((long)&(pCVar5->super_IConsole).super_IInterface._vptr_IInterface + 1)
        ;
        uVar4 = (pResult->super_IResult).m_NumArgs;
        (pResult->super_IResult).m_NumArgs = uVar4 + 1;
        pResult->m_apArgs[uVar4] = (char *)pCVar6;
        pCVar5 = pCVar6;
        do {
          cVar7 = *(char *)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface;
          if (cVar7 == '\\') {
            pCVar8 = (CConsole *)
                     ((long)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface + 1);
            cVar7 = *(char *)((long)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface + 1)
            ;
            if ((cVar7 != '\"') && (cVar7 != '\\')) {
              cVar7 = '\\';
              pCVar8 = pCVar6;
            }
          }
          else {
            if (cVar7 == '\0') {
              uVar4 = 1;
              goto LAB_001239c9;
            }
            pCVar8 = pCVar6;
            if (cVar7 == '\"') goto LAB_001239a3;
          }
          *(char *)&(pCVar5->super_IConsole).super_IInterface._vptr_IInterface = cVar7;
          pCVar5 = (CConsole *)
                   ((long)&(pCVar5->super_IConsole).super_IInterface._vptr_IInterface + 1);
          pCVar6 = (CConsole *)
                   ((long)&(pCVar8->super_IConsole).super_IInterface._vptr_IInterface + 1);
        } while( true );
      }
      if (cVar1 == '\0') {
        uVar4 = (uint)!bVar2;
LAB_001239c9:
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return uVar4;
      }
      uVar4 = (pResult->super_IResult).m_NumArgs;
      (pResult->super_IResult).m_NumArgs = uVar4 + 1;
      pResult->m_apArgs[uVar4] = (char *)pCVar5;
      if (((cVar7 == 'f') || (cVar7 == 'i')) || (cVar7 == 's')) {
        pCVar6 = (CConsole *)str_skip_to_whitespace((char *)pCVar5);
        this = pCVar5;
      }
      else {
        pCVar6 = pCVar5;
        if (cVar7 == 'r') {
          str_utf8_trim_whitespaces_right((char *)pCVar5);
          uVar4 = 0;
          goto LAB_001239c9;
        }
      }
      pCVar5 = pCVar6;
      if (*(char *)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface != '\0') {
LAB_001239a3:
        *(char *)&(pCVar5->super_IConsole).super_IInterface._vptr_IInterface = '\0';
        pCVar6 = (CConsole *)((long)&(pCVar6->super_IConsole).super_IInterface._vptr_IInterface + 1)
        ;
      }
    }
    bVar3 = NextParam(this,&Command,&pFormat_local);
    uVar4 = (uint)bVar3;
  } while( true );
}

Assistant:

int CConsole::ParseArgs(CResult *pResult, const char *pFormat)
{
	char Command = *pFormat;
	char *pStr;
	int Optional = 0;
	int Error = 0;

	pStr = pResult->m_pArgsStart;

	while(!Error)
	{
		if(!Command)
			break;

		if(Command == '?')
			Optional = 1;
		else
		{
			pStr = str_skip_whitespaces(pStr);

			if(!(*pStr)) // error, non optional command needs value
			{
				if(!Optional)
				{
					Error = 1;
				}
				break;
			}

			// add token
			if(*pStr == '"')
			{
				char *pDst;
				pStr++;
				pResult->AddArgument(pStr);

				pDst = pStr; // we might have to process escape data
				while(1)
				{
					if(pStr[0] == '"')
						break;
					else if(pStr[0] == '\\')
					{
						if(pStr[1] == '\\')
							pStr++; // skip due to escape
						else if(pStr[1] == '"')
							pStr++; // skip due to escape
					}
					else if(pStr[0] == 0)
						return 1; // return error

					*pDst = *pStr;
					pDst++;
					pStr++;
				}

				// write null termination
				*pDst = 0;


				pStr++;
			}
			else
			{
				pResult->AddArgument(pStr);

				if(Command == 'r') // rest of the string
				{
					str_utf8_trim_whitespaces_right(pStr);
					break;
				}
				else if(Command == 'i') // validate int
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 'f') // validate float
					pStr = str_skip_to_whitespace(pStr);
				else if(Command == 's') // validate string
					pStr = str_skip_to_whitespace(pStr);

				if(pStr[0] != 0) // check for end of string
				{
					pStr[0] = 0;
					pStr++;
				}
			}
		}

		// fetch next command
		Error = NextParam(&Command, pFormat);
	}

	return Error;
}